

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O2

void info_print_revision(lyout *out,lys_revision *rev,uint8_t rev_size)

{
  undefined7 in_register_00000011;
  lys_revision *plVar1;
  ulong uVar2;
  
  ly_print(out,"%-*s",0xb,"Revisions: ");
  if ((int)CONCAT71(in_register_00000011,rev_size) != 0) {
    ly_print(out,"%s\n",rev);
    uVar2 = (ulong)rev_size;
    plVar1 = rev + 1;
    while (uVar2 = uVar2 - 1, uVar2 != 0) {
      ly_print(out,"%*s%s\n",0xb,"",plVar1);
      plVar1 = plVar1 + 1;
    }
    return;
  }
  ly_print(out,"\n");
  return;
}

Assistant:

static void
info_print_revision(struct lyout *out, const struct lys_revision *rev, uint8_t rev_size)
{
    int i;

    ly_print(out, "%-*s", INDENT_LEN, "Revisions: ");

    if (rev_size) {
        ly_print(out, "%s\n", rev[0].date);
        for (i = 1; i < rev_size; ++i) {
            ly_print(out, "%*s%s\n", INDENT_LEN, "", rev[i].date);
        }
    } else {
        ly_print(out, "\n");
    }
}